

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_ldrddi.cpp
# Opt level: O2

ze_result_t
loader::zeCommandQueueSynchronize(ze_command_queue_handle_t hCommandQueue,uint64_t timeout)

{
  ze_result_t zVar1;
  
  if (*(code **)(*(long *)(hCommandQueue + 8) + 0x1f8) != (code *)0x0) {
    zVar1 = (**(code **)(*(long *)(hCommandQueue + 8) + 0x1f8))(*(undefined8 *)hCommandQueue);
    return zVar1;
  }
  return ZE_RESULT_ERROR_UNINITIALIZED;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeCommandQueueSynchronize(
        ze_command_queue_handle_t hCommandQueue,        ///< [in] handle of the command queue
        uint64_t timeout                                ///< [in] if non-zero, then indicates the maximum time (in nanoseconds) to
                                                        ///< yield before returning ::ZE_RESULT_SUCCESS or ::ZE_RESULT_NOT_READY;
                                                        ///< if zero, then immediately returns the status of the command queue;
                                                        ///< if `UINT64_MAX`, then function will not return until complete or
                                                        ///< device is lost.
                                                        ///< Due to external dependencies, timeout may be rounded to the closest
                                                        ///< value allowed by the accuracy of those dependencies.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // extract driver's function pointer table
        auto dditable = reinterpret_cast<ze_command_queue_object_t*>( hCommandQueue )->dditable;
        auto pfnSynchronize = dditable->ze.CommandQueue.pfnSynchronize;
        if( nullptr == pfnSynchronize )
            return ZE_RESULT_ERROR_UNINITIALIZED;

        // convert loader handle to driver handle
        hCommandQueue = reinterpret_cast<ze_command_queue_object_t*>( hCommandQueue )->handle;

        // forward to device-driver
        result = pfnSynchronize( hCommandQueue, timeout );

        return result;
    }